

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scan_state.cpp
# Opt level: O2

void __thiscall
duckdb::ScanFilterInfo::Initialize
          (ScanFilterInfo *this,ClientContext *context,TableFilterSet *filters,
          vector<duckdb::StorageIndex,_true> *column_ids)

{
  unsafe_vector<bool> *this_00;
  pointer __p;
  type __args_3;
  _Base_ptr p_Var1;
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>,_std::_Select1st<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>_>
  *this_01;
  iterator iVar2;
  TableFilterSet *pTVar3;
  pointer local_40;
  ClientContext *local_38;
  
  (this->table_filters).ptr = filters;
  local_38 = context;
  make_uniq<duckdb::AdaptiveFilter,duckdb::TableFilterSet&>((duckdb *)&local_40,filters);
  __p = local_40;
  local_40 = (pointer)0x0;
  ::std::__uniq_ptr_impl<duckdb::AdaptiveFilter,_std::default_delete<duckdb::AdaptiveFilter>_>::
  reset((__uniq_ptr_impl<duckdb::AdaptiveFilter,_std::default_delete<duckdb::AdaptiveFilter>_> *)
        &this->adaptive_filter,__p);
  ::std::unique_ptr<duckdb::AdaptiveFilter,_std::default_delete<duckdb::AdaptiveFilter>_>::
  ~unique_ptr((unique_ptr<duckdb::AdaptiveFilter,_std::default_delete<duckdb::AdaptiveFilter>_> *)
              &local_40);
  ::std::vector<duckdb::ScanFilter,_std::allocator<duckdb::ScanFilter>_>::reserve
            (&(this->filter_list).
              super_vector<duckdb::ScanFilter,_std::allocator<duckdb::ScanFilter>_>,
             (filters->filters)._M_t._M_impl.super__Rb_tree_header._M_node_count);
  for (p_Var1 = (filters->filters)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(filters->filters)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Base_ptr)::std::_Rb_tree_increment(p_Var1)) {
    __args_3 = unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>::
               operator*((unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>
                          *)&p_Var1[1]._M_parent);
    ::std::vector<duckdb::ScanFilter,std::allocator<duckdb::ScanFilter>>::
    emplace_back<duckdb::ClientContext&,unsigned_long_const&,duckdb::vector<duckdb::StorageIndex,true>const&,duckdb::TableFilter&>
              ((vector<duckdb::ScanFilter,std::allocator<duckdb::ScanFilter>> *)&this->filter_list,
               local_38,(unsigned_long *)(p_Var1 + 1),column_ids,__args_3);
  }
  this_00 = &this->column_has_filter;
  ::std::vector<bool,_std::allocator<bool>_>::reserve
            (&this_00->super_vector<bool,_std::allocator<bool>_>,
             (long)(column_ids->
                   super_vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>).
                   super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(column_ids->
                   super_vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>).
                   super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>.
                   _M_impl.super__Vector_impl_data._M_start >> 5);
  for (local_40 = (pointer)0x0;
      local_40 <
      (pointer)((long)(column_ids->
                      super_vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>).
                      super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(column_ids->
                      super_vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>).
                      super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 5);
      local_40 = (pointer)((long)&(local_40->permutation).
                                  super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_start + 1)) {
    this_01 = (_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>,_std::_Select1st<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>_>
               *)optional_ptr<duckdb::TableFilterSet,_true>::operator->(&this->table_filters);
    iVar2 = ::std::
            _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>,_std::_Select1st<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>_>
            ::find(this_01,(key_type *)&local_40);
    pTVar3 = optional_ptr<duckdb::TableFilterSet,_true>::operator->(&this->table_filters);
    ::std::vector<bool,_std::allocator<bool>_>::push_back
              (&this_00->super_vector<bool,_std::allocator<bool>_>,
               (_Rb_tree_header *)iVar2._M_node !=
               &(pTVar3->filters)._M_t._M_impl.super__Rb_tree_header);
  }
  ::std::vector<bool,_std::allocator<bool>_>::operator=
            (&(this->base_column_has_filter).super_vector<bool,_std::allocator<bool>_>,
             &this_00->super_vector<bool,_std::allocator<bool>_>);
  return;
}

Assistant:

void ScanFilterInfo::Initialize(ClientContext &context, TableFilterSet &filters,
                                const vector<StorageIndex> &column_ids) {
	D_ASSERT(!filters.filters.empty());
	table_filters = &filters;
	adaptive_filter = make_uniq<AdaptiveFilter>(filters);
	filter_list.reserve(filters.filters.size());
	for (auto &entry : filters.filters) {
		filter_list.emplace_back(context, entry.first, column_ids, *entry.second);
	}
	column_has_filter.reserve(column_ids.size());
	for (idx_t col_idx = 0; col_idx < column_ids.size(); col_idx++) {
		bool has_filter = table_filters->filters.find(col_idx) != table_filters->filters.end();
		column_has_filter.push_back(has_filter);
	}
	base_column_has_filter = column_has_filter;
}